

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall TPZFMatrix<long_double>::~TPZFMatrix(TPZFMatrix<long_double> *this)

{
  void *in_RDI;
  
  ~TPZFMatrix((TPZFMatrix<long_double> *)0x1226a98);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

TPZFMatrix<TVar>::~TPZFMatrix() {
    if(fElem && fElem != fGiven) delete[]( fElem );
    fElem = 0;
    fSize = 0;
}